

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O3

void CRenderTools::RenderEvalEnvelope
               (CEnvPoint *pPoints,int NumPoints,int Channels,float Time,float *pResult)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  CEnvPoint *pCVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float p3;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (NumPoints != 1) {
    if (NumPoints == 0) {
      fVar10 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      goto LAB_00189826;
    }
    uVar1 = NumPoints - 1;
    auVar15._4_12_ = in_XMM1._4_12_;
    auVar15._0_4_ = (float)pPoints[(int)uVar1].super_CEnvPoint_v1.m_Time / 1000.0;
    fVar10 = (float)FUN_00113d40(Time,auVar15._0_8_);
    if (1 < NumPoints) {
      fVar10 = fVar10 * 1000.0;
      pCVar9 = pPoints + 1;
      lVar7 = 0;
      do {
        iVar4 = pCVar9[-1].super_CEnvPoint_v1.m_Time;
        fVar12 = (float)iVar4;
        if ((fVar12 <= fVar10) &&
           (iVar5 = (pCVar9->super_CEnvPoint_v1).m_Time, fVar10 <= (float)iVar5)) {
          fVar12 = (fVar10 - fVar12) / (float)(iVar5 - iVar4);
          switch(pCVar9[-1].super_CEnvPoint_v1.m_Curvetype) {
          case 0:
            fVar12 = 0.0;
            break;
          case 2:
            fVar12 = fVar12 * fVar12 * fVar12;
            break;
          case 3:
            fVar12 = 1.0 - fVar12;
            fVar12 = 1.0 - fVar12 * fVar12 * fVar12;
            break;
          case 4:
            fVar12 = fVar12 * -2.0 * fVar12 * fVar12 + fVar12 * 3.0 * fVar12;
            break;
          case 5:
            if (Channels < 1) {
              return;
            }
            piVar6 = (int *)((long)pPoints + (0x80 - lVar7));
            uVar8 = 0;
            do {
              auVar18._0_4_ = (float)pCVar9[-1].super_CEnvPoint_v1.m_Time;
              auVar18._4_4_ = (float)piVar6[-0x12];
              auVar18._8_8_ = 0;
              auVar15 = divps(auVar18,_DAT_001dd8d0);
              auVar17._0_4_ = (float)(pCVar9->super_CEnvPoint_v1).m_Time;
              auVar17._4_4_ = (float)piVar6[-4];
              auVar17._8_8_ = 0;
              auVar18 = divps(auVar17,_DAT_001dd8d0);
              fVar13 = auVar15._0_4_;
              fVar14 = auVar15._4_4_ + fVar13;
              p3 = auVar18._0_4_;
              fVar16 = auVar18._4_4_ + p3;
              fVar12 = p3;
              if (fVar14 <= p3) {
                fVar12 = fVar14;
              }
              fVar11 = p3;
              if (fVar16 <= p3) {
                fVar11 = fVar16;
              }
              iVar4 = piVar6[-8];
              iVar5 = piVar6[-0x1e];
              iVar2 = *piVar6;
              iVar3 = piVar6[-0xe];
              fVar13 = SolveBezier(fVar10 / 1000.0,fVar13,
                                   (float)(-(uint)(fVar14 < fVar13) & (uint)fVar13 |
                                          ~-(uint)(fVar14 < fVar13) & (uint)fVar12),
                                   (float)(-(uint)(fVar16 < fVar13) & (uint)fVar13 |
                                          ~-(uint)(fVar16 < fVar13) & (uint)fVar11),p3);
              fVar12 = 1.0;
              if (fVar13 <= 1.0) {
                fVar12 = fVar13;
              }
              fVar14 = (float)iVar5 * 0.0009765625;
              fVar12 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar12);
              fVar16 = (float)iVar2 * 0.0009765625 + (float)iVar4 * 0.0009765625;
              fVar13 = (float)iVar3 * 0.0009765625 + fVar14;
              fVar14 = (fVar13 - fVar14) * fVar12 + fVar14;
              fVar13 = (fVar16 - fVar13) * fVar12 + fVar13;
              fVar14 = (fVar13 - fVar14) * fVar12 + fVar14;
              pResult[uVar8] =
                   ((((((float)iVar4 * 0.0009765625 - fVar16) * fVar12 + fVar16) - fVar13) * fVar12
                    + fVar13) - fVar14) * fVar12 + fVar14;
              uVar8 = uVar8 + 1;
              piVar6 = piVar6 + 1;
            } while ((uint)Channels != uVar8);
            return;
          }
          if (Channels < 1) {
            return;
          }
          piVar6 = (int *)((long)pPoints + (0x60 - lVar7));
          uVar8 = 0;
          do {
            pResult[uVar8] =
                 ((float)*piVar6 * 0.0009765625 - (float)piVar6[-0x16] * 0.0009765625) * fVar12 +
                 (float)piVar6[-0x16] * 0.0009765625;
            uVar8 = uVar8 + 1;
            piVar6 = piVar6 + 1;
          } while ((uint)Channels != uVar8);
          return;
        }
        lVar7 = lVar7 + -0x58;
        pCVar9 = pCVar9 + 1;
      } while ((ulong)uVar1 * 0x58 + lVar7 != 0);
    }
    pPoints = pPoints + (int)uVar1;
  }
  fVar10 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[0] * 0.0009765625;
  fVar12 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[1] * 0.0009765625;
  fVar13 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[2] * 0.0009765625;
  fVar14 = (float)(pPoints->super_CEnvPoint_v1).m_aValues[3] * 0.0009765625;
LAB_00189826:
  *pResult = fVar10;
  pResult[1] = fVar12;
  pResult[2] = fVar13;
  pResult[3] = fVar14;
  return;
}

Assistant:

void CRenderTools::RenderEvalEnvelope(const CEnvPoint *pPoints, int NumPoints, int Channels, float Time, float *pResult)
{
	if(NumPoints == 0)
	{
		pResult[0] = 0;
		pResult[1] = 0;
		pResult[2] = 0;
		pResult[3] = 0;
		return;
	}

	if(NumPoints == 1)
	{
		pResult[0] = fx2f(pPoints[0].m_aValues[0]);
		pResult[1] = fx2f(pPoints[0].m_aValues[1]);
		pResult[2] = fx2f(pPoints[0].m_aValues[2]);
		pResult[3] = fx2f(pPoints[0].m_aValues[3]);
		return;
	}

	Time = fmod(Time, pPoints[NumPoints-1].m_Time/1000.0f)*1000.0f;

	for(int i = 0; i < NumPoints-1; i++)
	{
		if(Time >= pPoints[i].m_Time && Time <= pPoints[i+1].m_Time)
		{
			float Delta = pPoints[i+1].m_Time-pPoints[i].m_Time;
			float a = (Time-pPoints[i].m_Time)/Delta;

			switch(pPoints[i].m_Curvetype)
			{
			case CURVETYPE_STEP:
				a = 0;
				break;
			case CURVETYPE_SMOOTH:
				a = -2*a*a*a + 3*a*a; // second hermite basis
				break;
			case CURVETYPE_SLOW:
				a = a*a*a;
				break;
			case CURVETYPE_FAST:
				a = 1-a;
				a = 1-a*a*a;
				break;
			case CURVETYPE_BEZIER:
				for(int c = 0; c < Channels; c++)
				{
					// monotonic 2d cubic bezier curve
					vec2 p0, p1, p2, p3;
					vec2 inTang, outTang;

					p0 = vec2(pPoints[i].m_Time/1000.0f, fx2f(pPoints[i].m_aValues[c]));
					p3 = vec2(pPoints[i+1].m_Time/1000.0f, fx2f(pPoints[i+1].m_aValues[c]));

					outTang = vec2(pPoints[i].m_aOutTangentdx[c]/1000.0f, fx2f(pPoints[i].m_aOutTangentdy[c]));
					inTang = -vec2(pPoints[i+1].m_aInTangentdx[c]/1000.0f, fx2f(pPoints[i+1].m_aInTangentdy[c]));
					p1 = p0 + outTang;
					p2 = p3 - inTang;

					// validate bezier curve
					ValidateFCurve(p0, p1, p2, p3);

					// solve x(a) = time for a
					a = clamp(SolveBezier(Time/1000.0f, p0.x, p1.x, p2.x, p3.x), 0.0f, 1.0f);

					// value = y(t)
					pResult[c] =  bezier(p0.y, p1.y, p2.y, p3.y, a);
				}
				return;
			case CURVETYPE_LINEAR:
				break;
			}

			for(int c = 0; c < Channels; c++)
			{
				float v0 = fx2f(pPoints[i].m_aValues[c]);
				float v1 = fx2f(pPoints[i+1].m_aValues[c]);
				pResult[c] = mix(v0, v1, a);
			}

			return;
		}
	}

	pResult[0] = fx2f(pPoints[NumPoints-1].m_aValues[0]);
	pResult[1] = fx2f(pPoints[NumPoints-1].m_aValues[1]);
	pResult[2] = fx2f(pPoints[NumPoints-1].m_aValues[2]);
	pResult[3] = fx2f(pPoints[NumPoints-1].m_aValues[3]);
	return;
}